

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O1

void __thiscall wasm::ReReloop::triage(ReReloop *this,Expression *curr)

{
  Id IVar1;
  Expression *pEVar2;
  Fatal local_198;
  
  IVar1 = curr->_id;
  switch(IVar1) {
  case BlockId:
    BlockTask::handle(this,(Block *)curr);
    return;
  case IfId:
    IfTask::handle(this,(If *)curr);
    return;
  case LoopId:
    LoopTask::handle(this,(Loop *)curr);
    return;
  case BreakId:
    BreakTask::handle(this,(Break *)curr);
    return;
  case SwitchId:
    SwitchTask::handle(this,(Switch *)curr);
    return;
  }
  if (IVar1 == ReturnId) {
    ReturnTask::handle(this,(Return *)curr);
    return;
  }
  if (IVar1 == UnreachableId) {
    UnreachableTask::handle(this,(Unreachable *)curr);
    return;
  }
  if (IVar1 - TryId < 3) {
    Fatal::Fatal(&local_198);
    Fatal::operator<<(&local_198,(char (*) [46])"ReReloop does not support EH instructions yet");
    Fatal::~Fatal(&local_198);
  }
  pEVar2 = this->currCFGBlock->Code;
  if (pEVar2->_id != BlockId) {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,"T *wasm::Expression::cast() [T = wasm::Block]");
  }
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(pEVar2 + 2),
             curr);
  return;
}

Assistant:

void triage(Expression* curr) {
    if (auto* block = curr->dynCast<Block>()) {
      BlockTask::handle(*this, block);
    } else if (auto* loop = curr->dynCast<Loop>()) {
      LoopTask::handle(*this, loop);
    } else if (auto* iff = curr->dynCast<If>()) {
      IfTask::handle(*this, iff);
    } else if (auto* br = curr->dynCast<Break>()) {
      BreakTask::handle(*this, br);
    } else if (auto* sw = curr->dynCast<Switch>()) {
      SwitchTask::handle(*this, sw);
    } else if (auto* ret = curr->dynCast<Return>()) {
      ReturnTask::handle(*this, ret);
    } else if (auto* un = curr->dynCast<Unreachable>()) {
      UnreachableTask::handle(*this, un);
    } else if (curr->is<Try>() || curr->is<Throw>() || curr->is<Rethrow>()) {
      Fatal() << "ReReloop does not support EH instructions yet";
    } else {
      // not control flow, so just a simple element
      getCurrBlock()->list.push_back(curr);
    }
  }